

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

void ritobin::io::json_impl::json_value_impl<ritobin::List2,_(ritobin::Category)6>::to_json_info
               (List2 *value,json *json)

{
  bool bVar1;
  json_value *this;
  Value *value_00;
  reference json_00;
  initializer_list_t init;
  Element *item;
  const_iterator __end0;
  const_iterator __begin0;
  ElementList *__range3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  json *local_18;
  json *json_local;
  List2 *value_local;
  
  local_18 = json;
  json_local = (json *)value;
  std::
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&__range3);
  init._M_len = (size_type)__range3;
  init._M_array = (iterator)&local_28;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::array(init);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(local_18,&local_28);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_28);
  this = &json_local->m_value;
  __end0 = std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::begin
                     ((vector<ritobin::Element,_std::allocator<ritobin::Element>_> *)this);
  item = (Element *)
         std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>::end
                   ((vector<ritobin::Element,_std::allocator<ritobin::Element>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                      (&__end0,(__normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                                *)&item);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    value_00 = &__gnu_cxx::
                __normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
                ::operator*(&__end0)->value;
    json_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::emplace_back<>(local_18);
    value_to_json_info(value_00,json_00);
    __gnu_cxx::
    __normal_iterator<const_ritobin::Element_*,_std::vector<ritobin::Element,_std::allocator<ritobin::Element>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

static void to_json_info(T const& value, json& json) noexcept {
            json = json::array();
            for (auto const& item: value.items) {
                value_to_json_info(item.value, json.emplace_back());
            }
        }